

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void ecs_run_add_actions(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t row,
                        int32_t count,ecs_entities_t *added,_Bool get_all,_Bool run_on_set)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ecs_vector_t *trigger_vec;
  _Bool _Var5;
  ecs_table_t *node;
  ulong uVar6;
  long lVar7;
  ecs_entity_t component;
  ecs_entities_t to_remove;
  ecs_column_info_t cinfo [32];
  ulong local_378;
  int32_t local_36c;
  ulong local_368;
  ecs_entities_t local_360;
  ecs_entities_t *local_350;
  ecs_type_t local_348;
  ecs_column_t *local_340;
  ecs_column_info_t local_338 [32];
  
  _ecs_assert(added != (ecs_entities_t *)0x0,0xc,(char *)0x0,"added != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x374);
  if (added == (ecs_entities_t *)0x0) {
    __assert_fail("added != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x374,
                  "void ecs_run_add_actions(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool, _Bool)"
                 );
  }
  _ecs_assert(added->count < 0x20,2,(char *)0x0,"added->count < ECS_MAX_ADD_REMOVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x375);
  if (0x1f < added->count) {
    __assert_fail("added->count < (32)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x375,
                  "void ecs_run_add_actions(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool, _Bool)"
                 );
  }
  ecs_get_column_info(world,table,added,local_338,get_all);
  uVar1 = added->count;
  uVar6 = (ulong)uVar1;
  if ((table->flags & 4) != 0) {
    _ecs_assert(data != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x2c2);
    if (data == (ecs_data_t *)0x0) {
      __assert_fail("data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x2c2,
                    "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                   );
    }
    local_350 = added;
    _ecs_assert(uVar6 != 0,0xc,(char *)0x0,"component_count != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x2c3);
    if (uVar6 == 0) {
      __assert_fail("component_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x2c3,
                    "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                   );
    }
    node = table;
    local_368 = uVar6;
    if (0 < (int)uVar1) {
      local_340 = data->columns;
      local_348 = table->type;
      local_36c = table->column_count;
      lVar7 = 0;
      do {
        uVar3 = *(ulong *)((long)&local_338[0].id + lVar7);
        local_378 = uVar3;
        if ((char)(uVar3 >> 0x38) == -2) {
          _ecs_assert((uVar3 & 0xffffffffffffff) != 0,2,(char *)0x0,"base != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x2d3);
          if ((uVar3 & 0xffffffffffffff) == 0) {
            __assert_fail("base != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                          ,0x2d3,
                          "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                         );
          }
          instantiate(world,uVar3 & 0xffffffffffffff,table,data,row,count);
          local_360.array = &local_378;
          local_360.count = 1;
          node = ecs_table_traverse_remove(world,node,&local_360,(ecs_entities_t *)0x0);
        }
        iVar2 = *(int *)((long)&local_338[0].column + lVar7);
        if (((long)iVar2 != -1) && (iVar2 < local_36c)) {
          _Var5 = override_component(world,local_378,local_348,data,local_340 + iVar2,row,count);
          if (_Var5) {
            local_360.array = &local_378;
            local_360.count = 1;
            node = ecs_table_traverse_remove(world,node,&local_360,(ecs_entities_t *)0x0);
          }
        }
        lVar7 = lVar7 + 0x18;
      } while (uVar6 * 0x18 != lVar7);
    }
    added = local_350;
    uVar6 = local_368;
    if ((run_on_set) && (node != table)) {
      ecs_run_monitors(world,table,table->on_set_all,row,count,node->on_set_all);
    }
  }
  if ((table->flags & 0x10000) != 0) {
    set_switch(world,table,data,row,count,added,false);
  }
  if ((table->flags & 0x800) != 0) {
    _ecs_assert(data != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x340);
    if (data == (ecs_data_t *)0x0) {
      __assert_fail("data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x340,
                    "void ecs_components_on_add(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t)"
                   );
    }
    if (0 < (int)uVar6) {
      lVar7 = 0;
      do {
        lVar4 = *(long *)((long)&local_338[0].ci + lVar7);
        if ((lVar4 != 0) &&
           (trigger_vec = *(ecs_vector_t **)(lVar4 + 8), trigger_vec != (ecs_vector_t *)0x0)) {
          ecs_run_component_trigger
                    (world,trigger_vec,*(ecs_entity_t *)((long)&local_338[0].id + lVar7),table,data,
                     row,count);
        }
        lVar7 = lVar7 + 0x18;
      } while (uVar6 * 0x18 != lVar7);
    }
  }
  return;
}

Assistant:

void ecs_run_add_actions(
    ecs_world_t * world,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_entities_t * added,
    bool get_all,
    bool run_on_set)
{
    ecs_assert(added != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(added->count < ECS_MAX_ADD_REMOVE, ECS_INVALID_PARAMETER, NULL);

    ecs_column_info_t cinfo[ECS_MAX_ADD_REMOVE];
    ecs_get_column_info(world, table, added, cinfo, get_all);
    int added_count = added->count;

    if (table->flags & EcsTableHasBase) {
        ecs_components_override(
            world, table, data, row, count, cinfo, 
            added_count, run_on_set);
    }

    if (table->flags & EcsTableHasSwitch) {
        ecs_components_switch(world, table, data, row, count, added, NULL);
    }

    if (table->flags & EcsTableHasOnAdd) {
        ecs_components_on_add(world, table, data, row, count, 
            cinfo, added_count);
    }
}